

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

float vkt::sr::anon_unknown_0::getSingleULPForExponent(int exp,int numMantissaBits)

{
  float fVar1;
  float fVar2;
  Float<unsigned_int,_8,_23,_127,_3U> local_24;
  Float<unsigned_int,_8,_23,_127,_3U> local_20;
  Float<unsigned_int,_8,_23,_127,_3U> local_1c;
  int local_18;
  int local_14;
  int ulpBitNdx;
  int numMantissaBits_local;
  int exp_local;
  
  local_14 = numMantissaBits;
  ulpBitNdx = exp;
  if (numMantissaBits < 1) {
    local_24 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct(1,exp,0x800000);
    numMantissaBits_local = (int)tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_24);
  }
  else {
    local_18 = 0x17 - numMantissaBits;
    local_1c = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct
                         (1,exp,1 << ((byte)local_18 & 0x1f) | 0x800000);
    fVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_1c);
    local_20 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct(1,ulpBitNdx,0x800000);
    fVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_20);
    numMantissaBits_local = (int)(fVar1 - fVar2);
  }
  return (float)numMantissaBits_local;
}

Assistant:

static float getSingleULPForExponent (int exp, int numMantissaBits)
{
	if (numMantissaBits > 0)
	{
		DE_ASSERT(numMantissaBits <= 23);

		const int ulpBitNdx = 23-numMantissaBits;
		return tcu::Float32::construct(+1, exp, (1<<23) | (1 << ulpBitNdx)).asFloat() - tcu::Float32::construct(+1, exp, (1<<23)).asFloat();
	}
	else
	{
		DE_ASSERT(numMantissaBits == 0);
		return tcu::Float32::construct(+1, exp, (1<<23)).asFloat();
	}
}